

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O2

void __thiscall undo::UndoHistory::clearRedo(UndoHistory *this)

{
  UndoState *pUVar1;
  UndoState **ppUVar2;
  UndoState *state;
  
  state = this->m_last;
  pUVar1 = this->m_cur;
  ppUVar2 = &pUVar1->m_next;
  if (pUVar1 == (UndoState *)0x0) {
    ppUVar2 = &this->m_first;
  }
  *ppUVar2 = (UndoState *)0x0;
  this->m_last = pUVar1;
  while ((state != (UndoState *)0x0 && (state != this->m_cur))) {
    pUVar1 = state->m_prev;
    deleteState(this,state);
    state = pUVar1;
  }
  return;
}

Assistant:

void UndoHistory::clearRedo()
{
  UndoState* state = m_last;

  // First we break the chain of undo states because deleteState() can
  // generate an onDeleteUndoState() notification which might try to
  // iterate over the whole UndoHistory.
  if (m_cur) {
    m_cur->m_next = nullptr;
    m_last = m_cur;
  }
  else {
    m_first = m_last = nullptr;
  }

  for (UndoState* prev = nullptr;
       state && state != m_cur;
       state = prev) {
    prev = state->m_prev;
    deleteState(state);
  }
}